

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O1

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,false>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,__1,__1,_0,__1,__1> *dst,
               Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *src,
               assign_op<float,_float> *func)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  Index innerSize;
  undefined8 *puVar6;
  Index outerSize;
  float *pfVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  Index col;
  ulong uVar11;
  Index row;
  ulong uVar12;
  long lVar13;
  Index row_1;
  PointerType pfVar14;
  
  pfVar14 = (src->
            super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
            ).
            super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
            .
            super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
            .m_data;
  uVar1 = (src->
          super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
          ).
          super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
          .m_rows.m_value;
  lVar2 = (((src->
            super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
            ).
            super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
           .m_xpr)->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
          m_rows;
  uVar10 = (src->
           super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
           .m_cols.m_value;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
       uVar1) ||
     ((dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
      uVar10)) {
    if ((long)(uVar10 | uVar1) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, -1>]"
                   );
    }
    if ((uVar10 != 0 && uVar1 != 0) &&
       (auVar4 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar4 / SEXT816((long)uVar10),0) < (long)uVar1)) {
      puVar6 = (undefined8 *)
               __cxa_allocate_exception(8,src,SUB168(auVar4 % SEXT816((long)uVar10),0));
      *puVar6 = boost::program_options::detail::cmdline::cmdline;
      __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<float,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<float,__1,__1,__1,_0> *)dst,uVar10 * uVar1,uVar1,uVar10);
  }
  uVar3 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if ((uVar3 == uVar1) &&
     (uVar1 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols, uVar1 == uVar10)) {
    if (0 < (long)uVar1) {
      pfVar7 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      uVar9 = (ulong)(-(int)uVar3 & 3);
      uVar10 = 0;
      uVar11 = 0;
      do {
        if (0 < (long)uVar10) {
          uVar12 = 0;
          do {
            pfVar7[uVar12] = pfVar14[uVar12];
            uVar12 = uVar12 + 1;
          } while (uVar10 != uVar12);
        }
        uVar8 = uVar3 - uVar10 & 0xfffffffffffffffc;
        lVar13 = uVar8 + uVar10;
        uVar12 = uVar10;
        if (0 < (long)uVar8) {
          do {
            uVar5 = *(undefined8 *)(pfVar14 + uVar12 + 2);
            *(undefined8 *)(pfVar7 + uVar12) = *(undefined8 *)(pfVar14 + uVar12);
            *(undefined8 *)(pfVar7 + uVar12 + 2) = uVar5;
            uVar12 = uVar12 + 4;
          } while ((long)uVar12 < lVar13);
        }
        for (; lVar13 < (long)uVar3; lVar13 = lVar13 + 1) {
          pfVar7[lVar13] = pfVar14[lVar13];
        }
        uVar12 = uVar10 + uVar9;
        uVar10 = uVar10 + uVar9 + 3;
        if (-1 < (long)uVar12) {
          uVar10 = uVar12;
        }
        uVar10 = uVar12 - (uVar10 & 0xfffffffffffffffc);
        if ((long)uVar3 < (long)uVar10) {
          uVar10 = uVar3;
        }
        uVar11 = uVar11 + 1;
        pfVar14 = pfVar14 + lVar2;
        pfVar7 = pfVar7 + uVar3;
      } while (uVar11 != uVar1);
    }
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                ,0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, -1>, SrcXprType = Eigen::Block<const Eigen::Matrix<float, -1, -1>>, T1 = float, T2 = float]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}